

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O1

_Bool linear_vasprintf_rewrite_tail
                (void *parent,char **str,size_t *start,char *fmt,__va_list_tag *args)

{
  uint uVar1;
  size_t sVar2;
  char *__dest;
  size_t sVar3;
  char *pcVar4;
  uint size;
  
  if (str == (char **)0x0) {
    __assert_fail("str != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                  ,0x36d,
                  "_Bool linear_vasprintf_rewrite_tail(void *, char **, size_t *, const char *, struct __va_list_tag *)"
                 );
  }
  if (*str == (char *)0x0) {
    pcVar4 = linear_vasprintf(parent,fmt,args);
    *str = pcVar4;
    sVar3 = strlen(pcVar4);
  }
  else {
    sVar2 = printf_length(fmt,args);
    pcVar4 = *str;
    size = (int)*start + (int)sVar2 + 1;
    __dest = (char *)linear_alloc_child(parent,size);
    if ((pcVar4 != (char *)0x0) &&
       (uVar1 = *(uint *)(pcVar4 + -8), uVar1 != 0 && __dest != (char *)0x0)) {
      if (uVar1 < size) {
        size = uVar1;
      }
      memcpy(__dest,pcVar4,(ulong)size);
    }
    if (__dest == (char *)0x0) {
      return false;
    }
    vsnprintf(__dest + *start,sVar2 + 1,fmt,args);
    *str = __dest;
    sVar3 = *start + sVar2;
  }
  *start = sVar3;
  return true;
}

Assistant:

bool
linear_vasprintf_rewrite_tail(void *parent, char **str, size_t *start,
                              const char *fmt, va_list args)
{
   size_t new_length;
   char *ptr;

   assert(str != NULL);

   if (unlikely(*str == NULL)) {
      *str = linear_vasprintf(parent, fmt, args);
      *start = strlen(*str);
      return true;
   }

   new_length = printf_length(fmt, args);

   ptr = linear_realloc(parent, *str, *start + new_length + 1);
   if (unlikely(ptr == NULL))
      return false;

   vsnprintf(ptr + *start, new_length + 1, fmt, args);
   *str = ptr;
   *start += new_length;
   return true;
}